

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O1

base_learner * marginal_setup(options_i *options,vw *all)

{
  int iVar1;
  typed_option<float> *ptVar2;
  long lVar3;
  base_learner *l;
  single_learner *base;
  learner<MARGINAL::data,_example> *plVar4;
  size_t u;
  long lVar5;
  free_ptr<MARGINAL::data> d;
  option_group_definition marginal_options;
  string marginal;
  code *local_258;
  data *local_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 local_228 [112];
  bool local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  option_group_definition local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  scoped_calloc_or_throw<MARGINAL::data>();
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"VW options","");
  local_188.m_name._M_dataplus._M_p = (pointer)&local_188.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_188,local_130,local_130 + local_128);
  local_188.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"marginal","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_228,&local_50,&local_150);
  local_1b8 = true;
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"substitute marginal label estimates for ids","");
  std::__cxx11::string::_M_assign((string *)(local_228 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_188,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_228);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  local_228._0_8_ = &PTR__typed_option_002d5018;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"initial_denominator","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_228,&local_70,&local_250->initial_denominator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_228,1.0);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"initial denominator","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_188,ptVar2);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  local_228._0_8_ = &PTR__typed_option_002d50c0;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"initial_numerator","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_228,&local_90,&local_250->initial_numerator);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_228,0.5);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"initial numerator","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_188,ptVar2);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  local_228._0_8_ = &PTR__typed_option_002d50c0;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"compete","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_228,&local_b0,&local_250->compete);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"enable competition with marginal features","");
  std::__cxx11::string::_M_assign((string *)(local_228 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_188,(typed_option<bool> *)local_228);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  local_228._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"update_before_learn","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_228,&local_d0,&local_250->update_before_learn);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"update marginal values before learning","");
  std::__cxx11::string::_M_assign((string *)(local_228 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_188,(typed_option<bool> *)local_228);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  local_228._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"unweighted_marginals","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_228,&local_f0,&local_250->unweighted_marginals);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"ignore importance weights when computing marginals","");
  std::__cxx11::string::_M_assign((string *)(local_228 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_188,(typed_option<bool> *)local_228);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  local_228._0_8_ = &PTR__typed_option_002d4fb0;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"decay","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_228,&local_110,&local_250->decay);
  ptVar2 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_228,0.0);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"decay multiplier per event (1e-3 for example)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(&local_188,ptVar2);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  local_228._0_8_ = &PTR__typed_option_002d50c0;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_188);
  local_228._0_8_ = local_228 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"marginal","");
  iVar1 = (*options->_vptr_options_i[1])(options,local_228);
  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
    operator_delete((void *)local_228._0_8_);
  }
  if ((char)iVar1 == '\0') {
    plVar4 = (learner<MARGINAL::data,_example> *)0x0;
  }
  else {
    local_250->all = all;
    lVar5 = 0;
    do {
      lVar3 = std::__cxx11::string::find((char)&local_150,(ulong)(uint)(int)(char)lVar5);
      if (lVar3 != -1) {
        local_250->id_features[lVar5] = true;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar4 = LEARNER::learner<MARGINAL::data,example>::init_learner<LEARNER::learner<char,example>>
                       (local_250,base,MARGINAL::predict_or_learn<true>,
                        MARGINAL::predict_or_learn<false>,1,*(prediction_type_t *)(base + 0xd0));
    local_250 = (data *)0x0;
    *(undefined8 *)(plVar4 + 0xb8) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0xc0) = *(undefined8 *)(plVar4 + 0x20);
    *(code **)(plVar4 + 200) = MARGINAL::finish;
    *(code **)(plVar4 + 0x80) = MARGINAL::save_load;
    *(undefined8 *)(plVar4 + 0x70) = *(undefined8 *)(plVar4 + 0x18);
    *(undefined8 *)(plVar4 + 0x78) = *(undefined8 *)(plVar4 + 0x20);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_188.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.m_name._M_dataplus._M_p != &local_188.m_name.field_2) {
    operator_delete(local_188.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_250 != (data *)0x0) {
    (*local_258)();
  }
  return (base_learner *)plVar4;
}

Assistant:

LEARNER::base_learner* marginal_setup(options_i& options, vw& all)
{
  free_ptr<MARGINAL::data> d = scoped_calloc_or_throw<MARGINAL::data>();
  std::string marginal;

  option_group_definition marginal_options("VW options");
  marginal_options.add(make_option("marginal", marginal).keep().help("substitute marginal label estimates for ids"));
  marginal_options.add(
      make_option("initial_denominator", d->initial_denominator).default_value(1.f).help("initial denominator"));
  marginal_options.add(
      make_option("initial_numerator", d->initial_numerator).default_value(0.5f).help("initial numerator"));
  marginal_options.add(make_option("compete", d->compete).help("enable competition with marginal features"));
  marginal_options.add(
      make_option("update_before_learn", d->update_before_learn).help("update marginal values before learning"));
  marginal_options.add(make_option("unweighted_marginals", d->unweighted_marginals)
                           .help("ignore importance weights when computing marginals"));
  marginal_options.add(
      make_option("decay", d->decay).default_value(0.f).help("decay multiplier per event (1e-3 for example)"));
  options.add_and_parse(marginal_options);

  if (!options.was_supplied("marginal"))
  {
    return nullptr;
  }

  d->all = &all;

  for (size_t u = 0; u < 256; u++)
    if (marginal.find((char)u) != string::npos)
      d->id_features[u] = true;

  LEARNER::learner<MARGINAL::data, example>& ret =
      init_learner(d, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  ret.set_finish(finish);
  ret.set_save_load(save_load);

  return make_base(ret);
}